

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O2

void Sat_Solver2WriteDimacs
               (sat_solver2 *p,char *pFileName,lit *assumpBegin,lit *assumpEnd,int incrementVars)

{
  FILE *__stream;
  clause *pC;
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)p->size;
  if (p->size < 1) {
    uVar1 = uVar2;
  }
  iVar4 = 0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (p->levels[uVar2] == 0) {
      iVar4 = iVar4 + (uint)(p->assigns[uVar2] != '\x03');
    }
  }
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"p cnf %d %d\n",(ulong)(uint)p->size,
            (ulong)(((int)((ulong)((long)assumpEnd - (long)assumpBegin) >> 2) + iVar4 +
                     (p->Mem).nEntries[0] + (p->Mem).nEntries[1]) - 1));
    for (lVar5 = 0; lVar5 <= (p->Mem).iPage[0]; lVar5 = lVar5 + 2) {
      iVar4 = 2;
      while ((iVar4 < *(p->Mem).pPages[lVar5] &&
             (pC = Sat_MemClause(&p->Mem,(int)lVar5,iVar4), pC != (clause *)0x0))) {
        if ((lVar5 != 0) || (iVar4 != 2)) {
          Sat_SolverClauseWriteDimacs((FILE *)__stream,pC,incrementVars);
        }
        iVar4 = iVar4 + (((uint)*pC >> 0xb) + 3 & 0xfffffffe);
      }
    }
    pcVar6 = " 0";
    if (incrementVars == 0) {
      pcVar6 = "";
    }
    for (lVar5 = 0; lVar5 < p->size; lVar5 = lVar5 + 1) {
      if ((p->levels[lVar5] == 0) && (p->assigns[lVar5] != '\x03')) {
        pcVar3 = "-";
        if (p->assigns[lVar5] != '\x01') {
          pcVar3 = "";
        }
        fprintf(__stream,"%s%d%s\n",pcVar3,(ulong)((uint)(0 < incrementVars) + (int)lVar5),pcVar6);
      }
    }
    if (assumpBegin != (lit *)0x0) {
      for (; assumpBegin != assumpEnd; assumpBegin = (lit *)((uint *)assumpBegin + 1)) {
        pcVar3 = "-";
        if ((*assumpBegin & 1U) == 0) {
          pcVar3 = "";
        }
        fprintf(__stream,"%s%d%s\n",pcVar3,(ulong)((*assumpBegin >> 1) + (uint)(0 < incrementVars)),
                pcVar6);
      }
    }
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  puts("Sat_SolverWriteDimacs(): Cannot open the ouput file.");
  return;
}

Assistant:

void Sat_Solver2WriteDimacs( sat_solver2 * p, char * pFileName, lit* assumpBegin, lit* assumpEnd, int incrementVars )
{
    Sat_Mem_t * pMem = &p->Mem;
    FILE * pFile;
    clause * c;
    int i, k, nUnits;

    // count the number of unit clauses
    nUnits = 0;
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 )
            nUnits++;

    // start the file
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Sat_SolverWriteDimacs(): Cannot open the ouput file.\n" );
        return;
    }
//    fprintf( pFile, "c CNF generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "p cnf %d %d\n", p->size, Sat_MemEntryNum(&p->Mem, 0)-1+Sat_MemEntryNum(&p->Mem, 1)+nUnits+(int)(assumpEnd-assumpBegin) );

    // write the original clauses
    Sat_MemForEachClause2( pMem, c, i, k )
        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write the learned clauses
//    Sat_MemForEachLearned( pMem, c, i, k )
//        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write zero-level assertions
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 ) // varX
            fprintf( pFile, "%s%d%s\n",
                     (p->assigns[i] == 1)? "-": "",    // var0
                     i + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");

    // write the assump
    if (assumpBegin) {
        for (; assumpBegin != assumpEnd; assumpBegin++) {
            fprintf( pFile, "%s%d%s\n",
                     lit_sign(*assumpBegin)? "-": "",
                     lit_var(*assumpBegin) + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");
        }
    }

    fprintf( pFile, "\n" );
    fclose( pFile );
}